

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

void __thiscall HEkkPrimal::solvePhase1(HEkkPrimal *this)

{
  HEkk *this_00;
  bool bVar1;
  HighsDebugStatus HVar2;
  int iVar3;
  string *message;
  allocator local_41;
  string local_40;
  
  this_00 = this->ekk_instance_;
  (this_00->status_).has_dual_objective_value = false;
  (this_00->status_).has_primal_objective_value = false;
  bVar1 = HEkk::bailout(this_00);
  if (!bVar1) {
    highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kDetailed,
                "primal-phase1-start\n");
    if ((this_00->info_).valid_backtracking_basis_ == false) {
      HEkk::putBacktrackingBasis(this->ekk_instance_);
    }
    do {
      rebuild(this);
      if ((this->solve_phase | 2U) == 0xffffffff) {
        return;
      }
      bVar1 = HEkk::bailout(this->ekk_instance_);
      if (bVar1) {
        return;
      }
      if (this->solve_phase == 2) goto LAB_00344570;
      do {
        iterate(this);
        bVar1 = HEkk::bailout(this->ekk_instance_);
        if (bVar1) {
          return;
        }
        if (this->solve_phase == -3) {
          return;
        }
      } while (this->rebuild_reason == 0);
    } while ((((this_00->status_).has_fresh_rebuild != true) || (this->num_flip_since_rebuild != 0))
            || (bVar1 = HEkk::rebuildRefactor(this->ekk_instance_,this->rebuild_reason), bVar1));
    bVar1 = HEkk::tabooBadBasisChange(this->ekk_instance_);
    if (bVar1) {
      this->solve_phase = 5;
    }
    else {
LAB_00344570:
      message = &local_40;
      std::__cxx11::string::string((string *)message,"End of solvePhase1",&local_41);
      HVar2 = debugPrimalSimplex(this,message,false);
      std::__cxx11::string::~string((string *)&local_40);
      if (HVar2 == kLogicalError) {
        this->solve_phase = -3;
      }
      else {
        iVar3 = this->solve_phase;
        if ((iVar3 == 1) && (this->variable_in < 0)) {
          if ((this->ekk_instance_->info_).bounds_perturbed != true) {
            this->ekk_instance_->model_status_ = kInfeasible;
            this->solve_phase = -2;
            return;
          }
          cleanup(this,(EVP_PKEY_CTX *)message);
          iVar3 = this->solve_phase;
        }
        if ((iVar3 == 2) && ((this_00->info_).allow_bound_perturbation == false)) {
          highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,
                      kWarning,"Moving to phase 2, but not allowing bound perturbation\n");
        }
      }
    }
  }
  return;
}

Assistant:

void HEkkPrimal::solvePhase1() {
  HighsSimplexInfo& info = ekk_instance_.info_;
  HighsSimplexStatus& status = ekk_instance_.status_;
  // When starting a new phase the (updated) primal objective function
  // value isn't known. Indicate this so that when the value
  // computed from scratch in build() isn't checked against the
  // updated value
  status.has_primal_objective_value = false;
  status.has_dual_objective_value = false;
  // Possibly bail out immediately if iteration limit is current value
  if (ekk_instance_.bailout()) return;
  highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kDetailed,
              "primal-phase1-start\n");
  // If there's no backtracking basis, save the initial basis in case of
  // backtracking
  if (!info.valid_backtracking_basis_) ekk_instance_.putBacktrackingBasis();

  // Main solving structure
  for (;;) {
    //
    // Rebuild
    //
    // solve_phase = kSolvePhaseError is set if the basis matrix is singular
    rebuild();
    if (solve_phase == kSolvePhaseError) return;
    if (solve_phase == kSolvePhaseUnknown) return;
    if (ekk_instance_.bailout()) return;
    assert(solve_phase == kSolvePhase1 || solve_phase == kSolvePhase2);
    //
    // solve_phase = kSolvePhase2 is set if no primal infeasibilities
    // are found in rebuild(), in which case return for phase 2
    if (solve_phase == kSolvePhase2) break;

    for (;;) {
      iterate();
      if (ekk_instance_.bailout()) return;
      if (solve_phase == kSolvePhaseError) return;
      assert(solve_phase == kSolvePhase1);
      if (rebuild_reason) break;
    }
    // If the data are fresh from rebuild() and no flips have
    // occurred, possibly break out of the outer loop to see what's
    // occurred
    bool finished = status.has_fresh_rebuild && num_flip_since_rebuild == 0 &&
                    !ekk_instance_.rebuildRefactor(rebuild_reason);
    if (finished && ekk_instance_.tabooBadBasisChange()) {
      // A bad basis change has had to be made taboo without any other
      // basis changes or flips having been performed from a fresh
      // rebuild. In other words, the only basis change that could be
      // made is not permitted, so no definitive statement about the
      // LP can be made.
      solve_phase = kSolvePhaseTabooBasis;
      return;
    }
    if (finished) break;
  }
  // If bailing out, should have returned already
  assert(!ekk_instance_.solve_bailout_);
  // Will only have accurate simplex info if moving to phase 2 - but
  // should check primal feasibility and residual information if LP
  // is primal infeasible
  if (debugPrimalSimplex("End of solvePhase1") ==
      HighsDebugStatus::kLogicalError) {
    solve_phase = kSolvePhaseError;
    return;
  }
  if (solve_phase == kSolvePhase1) {
    // Determine whether primal infeasibility has been identified
    if (variable_in < 0) {
      // Optimal in phase 1, so should have primal infeasibilities
      assert(info.num_primal_infeasibilities > 0);
      if (ekk_instance_.info_.bounds_perturbed) {
        // Remove any bound perturbations and return to phase 1
        cleanup();
      } else {
        ekk_instance_.model_status_ = HighsModelStatus::kInfeasible;
        solve_phase = kSolvePhaseExit;
      }
    }
  }
  if (solve_phase == kSolvePhase2) {
    // Moving to phase 2 so comment if bound perturbation is not permitted
    //
    // It may have been prevented to avoid cleanup-perturbation loops
    if (!info.allow_bound_perturbation)
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kWarning,
                  "Moving to phase 2, but not allowing bound perturbation\n");
  }
}